

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_intersect_with_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  _Bool _Var1;
  roaring64_iterator_t it;
  
  if (min < max) {
    roaring64_iterator_init_at(r,&it,true);
    _Var1 = roaring64_iterator_move_equalorlarger(&it,min);
    if ((_Var1) && (it.has_value == true)) {
      _Var1 = it.value < max;
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool roaring64_bitmap_intersect_with_range(const roaring64_bitmap_t *r,
                                           uint64_t min, uint64_t max) {
    if (min >= max) {
        return false;
    }
    roaring64_iterator_t it;
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    if (!roaring64_iterator_move_equalorlarger(&it, min)) {
        return false;
    }
    return roaring64_iterator_has_value(&it) &&
           roaring64_iterator_value(&it) < max;
}